

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O1

int __thiscall
Centaurus::NFA<char>::select
          (NFA<char> *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
          timeval *__timeout)

{
  pointer pNVar1;
  int extraout_EAX;
  int dest;
  undefined4 in_register_00000034;
  long lVar2;
  NFABaseState<char,_int> *pNVar3;
  NFABaseState<char,_int> local_58;
  
  lVar2 = CONCAT44(in_register_00000034,__nfds);
  pNVar3 = (this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states.
           super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  dest = (int)((ulong)((long)(this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states.
                             super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar3) >> 3) *
         -0x33333333;
  local_58._vptr_NFABaseState = (_func_int **)&PTR__CharClass_00185b88;
  local_58.m_transitions.
  super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.m_transitions.
  super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.m_transitions.
  super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  NFABaseState<char,_int>::add_transition(pNVar3,(CharClass<char> *)&local_58,dest,false);
  local_58._vptr_NFABaseState = (_func_int **)&PTR__CharClass_00185b88;
  std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::~vector
            ((vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_> *)
             &local_58.m_transitions);
  pNVar3 = (NFABaseState<char,_int> *)(*(long *)(lVar2 + 8) + 0x28);
  if (pNVar3 != *(NFABaseState<char,_int> **)(lVar2 + 0x10)) {
    do {
      NFABaseState<char,_int>::offset(&local_58,pNVar3,dest + -1);
      std::
      vector<Centaurus::NFABaseState<char,int>,std::allocator<Centaurus::NFABaseState<char,int>>>::
      emplace_back<Centaurus::NFABaseState<char,int>>
                ((vector<Centaurus::NFABaseState<char,int>,std::allocator<Centaurus::NFABaseState<char,int>>>
                  *)&(this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states,&local_58);
      local_58._vptr_NFABaseState = (_func_int **)&PTR__NFABaseState_00185b20;
      std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
      ::~vector(&local_58.m_transitions);
      pNVar3 = pNVar3 + 1;
    } while (pNVar3 != *(NFABaseState<char,_int> **)(lVar2 + 0x10));
  }
  NFABaseState<char,_int>::rebase_transitions
            ((this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states.
             super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start,*(NFABaseState<char,_int> **)(lVar2 + 8),
             dest + -1);
  local_58._vptr_NFABaseState = (_func_int **)&PTR__CharClass_00185b88;
  local_58.m_transitions.
  super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.m_transitions.
  super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.m_transitions.
  super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  add_state(this,(CharClass<char> *)&local_58);
  local_58._vptr_NFABaseState = (_func_int **)&PTR__CharClass_00185b88;
  std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::~vector
            ((vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_> *)
             &local_58.m_transitions);
  local_58._vptr_NFABaseState = (_func_int **)&PTR__CharClass_00185b88;
  local_58.m_transitions.
  super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.m_transitions.
  super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.m_transitions.
  super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pNVar1 = (this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states.
           super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  NFABaseState<char,_int>::add_transition
            (pNVar1 + (dest + -1),(CharClass<char> *)&local_58,
             (int)((ulong)((long)(this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states
                                 .
                                 super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar1) >> 3) *
             -0x33333333 + -1,false);
  local_58._vptr_NFABaseState = (_func_int **)&PTR__CharClass_00185b88;
  std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::~vector
            ((vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_> *)
             &local_58.m_transitions);
  return extraout_EAX;
}

Assistant:

void select(const NFA<TCHAR>& nfa)
    {
        int initial_size = m_states.size();

        m_states[0].add_transition(CharClass<TCHAR>(), initial_size);

        auto i = nfa.m_states.cbegin() + 1;

        for (; i != nfa.m_states.cend(); i++)
        {
            m_states.push_back(i->offset(initial_size - 1));
        }

        m_states[0].rebase_transitions(nfa.m_states[0], initial_size - 1);

        //Add the join state
        add_state(CharClass<TCHAR>());

        add_transition_from(CharClass<TCHAR>(), initial_size - 1);
    }